

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O3

QSize __thiscall QIcon::actualSize(QIcon *this,QWindow *window,QSize *size,Mode mode,State state)

{
  QIconEngine *pQVar1;
  uint uVar2;
  int iVar3;
  QSize QVar4;
  undefined4 extraout_var_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  double displayDevicePixelRatio;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  ulong local_38;
  QSize local_30;
  long local_28;
  Representation extraout_var;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->d == (QIconPrivate *)0x0) {
    uVar6 = 0xffffffffffffffff;
  }
  else {
    if (window == (QWindow *)0x0) {
      displayDevicePixelRatio = QGuiApplication::devicePixelRatio(QCoreApplication::self);
    }
    else {
      displayDevicePixelRatio = QWindow::devicePixelRatio(window);
    }
    if (displayDevicePixelRatio <= 1.0) {
      pQVar1 = this->d->engine;
      iVar3 = (*pQVar1->_vptr_QIconEngine[3])(pQVar1,size,(ulong)mode,(ulong)state);
      uVar6 = CONCAT44(iVar3,extraout_var_00);
    }
    else {
      pQVar1 = this->d->engine;
      dVar9 = displayDevicePixelRatio * (double)(*size).wd.m_i;
      dVar12 = displayDevicePixelRatio * (double)(*size).ht.m_i;
      dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
      dVar12 = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
      auVar11._4_4_ = -(uint)(-2147483648.0 < dVar9);
      auVar11._0_4_ = -(uint)(-2147483648.0 < dVar12);
      auVar11._8_4_ = (int)-(ulong)(2147483647.0 < dVar12);
      auVar11._12_4_ = -(uint)(2147483647.0 < dVar9);
      uVar2 = movmskps((int)this->d,auVar11);
      uVar6 = 0x80000000;
      if ((uVar2 & 2) != 0) {
        uVar6 = (ulong)(uint)(int)dVar9;
      }
      uVar7 = 0x8000000000000000;
      if ((uVar2 & 1) != 0) {
        uVar7 = (ulong)(uint)(int)dVar12 << 0x20;
      }
      uVar5 = 0x7fffffff00000000;
      if ((uVar2 & 4) == 0) {
        uVar5 = uVar7;
      }
      local_38 = 0x7fffffff;
      if ((uVar2 & 8) == 0) {
        local_38 = uVar6;
      }
      local_38 = local_38 | uVar5;
      QVar4.wd.m_i = (*pQVar1->_vptr_QIconEngine[3])
                               (dVar12,dVar12,-(ulong)(2147483647.0 < dVar12),pQVar1,&local_38,
                                (ulong)mode,(ulong)state);
      QVar4.ht.m_i = extraout_var.m_i;
      local_30 = QVar4;
      auVar8._0_8_ = QIconPrivate::pixmapDevicePixelRatio(displayDevicePixelRatio,size,&local_30);
      auVar10._0_8_ = (double)extraout_var.m_i;
      auVar10._8_8_ = (double)QVar4.wd.m_i;
      auVar8._8_8_ = auVar8._0_8_;
      auVar11 = divpd(auVar10,auVar8);
      auVar13._0_8_ =
           (double)((ulong)auVar11._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._0_8_;
      auVar13._8_8_ =
           (double)((ulong)auVar11._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._8_8_;
      auVar11 = maxpd(auVar13,_DAT_006747a0);
      uVar6 = CONCAT44((int)(double)(~-(ulong)(2147483647.0 < auVar13._8_8_) & auVar11._8_8_ |
                                    -(ulong)(2147483647.0 < auVar13._8_8_) & 0x41dfffffffc00000),
                       (int)(double)(~-(ulong)(2147483647.0 < auVar13._0_8_) & auVar11._0_8_ |
                                    -(ulong)(2147483647.0 < auVar13._0_8_) & 0x41dfffffffc00000));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSize)(uVar6 >> 0x20 | uVar6 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QIcon::actualSize(QWindow *window, const QSize &size, Mode mode, State state) const
{
    if (!d)
        return QSize();

    qreal devicePixelRatio = window ? window->devicePixelRatio() : qApp->devicePixelRatio();

    // Handle the simple normal-dpi case:
    if (!(devicePixelRatio > 1.0))
        return d->engine->actualSize(size, mode, state);

    QSize actualSize = d->engine->actualSize(size * devicePixelRatio, mode, state);
    return actualSize / d->pixmapDevicePixelRatio(devicePixelRatio, size, actualSize);
}